

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxColorLiteral::Emit(FxColorLiteral *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FxExpression **ppFVar6;
  undefined4 extraout_var;
  ExpEmit local_34;
  ExpEmit work;
  ExpEmit in;
  int i;
  VMFunctionBuilder *build_local;
  FxColorLiteral *this_local;
  ExpEmit out;
  
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,0,1);
  uVar4 = (uint)(ushort)this_local;
  uVar2 = VMFunctionBuilder::GetConstantInt(build,this->constval);
  VMFunctionBuilder::Emit(build,2,uVar4,(VM_SHALF)uVar2);
  in.RegNum = 0;
  in.RegType = '\0';
  in.RegCount = '\0';
  do {
    if (3 < (int)in._0_4_) {
      EVar1.RegType = this_local._2_1_;
      EVar1.RegCount = this_local._3_1_;
      EVar1.Konst = (bool)this_local._4_1_;
      EVar1.Fixed = (bool)this_local._5_1_;
      EVar1.Final = (bool)this_local._6_1_;
      EVar1.Target = (bool)this_local._7_1_;
      EVar1.RegNum = (ushort)this_local;
      return EVar1;
    }
    ppFVar6 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                        (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                         (long)(int)in._0_4_);
    if (*ppFVar6 != (FxExpression *)0x0) {
      ppFVar6 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                           (long)(int)in._0_4_);
      iVar3 = (*(*ppFVar6)->_vptr_FxExpression[3])();
      if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
        __assert_fail("!ArgList[i]->isConstant()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x20f8,"virtual ExpEmit FxColorLiteral::Emit(VMFunctionBuilder *)");
      }
      ppFVar6 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                           (long)(int)in._0_4_);
      work._0_4_ = (*(*ppFVar6)->_vptr_FxExpression[9])(*ppFVar6,build);
      work.Konst = (bool)(char)extraout_var;
      work.Fixed = (bool)(char)((uint)extraout_var >> 8);
      work.Final = (bool)(char)((uint)extraout_var >> 0x10);
      work.Target = (bool)(char)((uint)extraout_var >> 0x18);
      ExpEmit::Free(&work,build);
      ExpEmit::ExpEmit(&local_34,build,0,1);
      uVar2 = (uint)local_34.RegNum;
      uVar4 = (uint)work.RegNum;
      uVar5 = VMFunctionBuilder::GetConstantInt(build,0);
      VMFunctionBuilder::Emit(build,0x80,uVar2,uVar4,uVar5);
      uVar2 = (uint)local_34.RegNum;
      uVar4 = (uint)local_34.RegNum;
      uVar5 = VMFunctionBuilder::GetConstantInt(build,0xff);
      VMFunctionBuilder::Emit(build,0x7e,uVar2,uVar4,uVar5);
      if (in._0_4_ != 3) {
        VMFunctionBuilder::Emit
                  (build,0x5b,(uint)local_34.RegNum,(uint)local_34.RegNum,in._0_4_ * -8 + 0x18);
      }
      VMFunctionBuilder::Emit
                (build,0x79,(uint)(ushort)this_local,(uint)(ushort)this_local,(uint)local_34.RegNum)
      ;
    }
    in._0_4_ = in._0_4_ + 1;
  } while( true );
}

Assistant:

ExpEmit FxColorLiteral::Emit(VMFunctionBuilder *build)
{
	ExpEmit out(build, REGT_INT);
	build->Emit(OP_LK, out.RegNum, build->GetConstantInt(constval));
	for (int i = 0; i < 4; i++)
	{
		if (ArgList[i] != nullptr)
		{
			assert(!ArgList[i]->isConstant());
			ExpEmit in = ArgList[i]->Emit(build);
			in.Free(build);
			ExpEmit work(build, REGT_INT);
			build->Emit(OP_MAX_RK, work.RegNum, in.RegNum, build->GetConstantInt(0));
			build->Emit(OP_MIN_RK, work.RegNum, work.RegNum, build->GetConstantInt(255));
			if (i != 3) build->Emit(OP_SLL_RI, work.RegNum, work.RegNum, 24 - (i * 8));
			build->Emit(OP_OR_RR, out.RegNum, out.RegNum, work.RegNum);
		}
	}
	return out;
}